

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateCanModelBeUpdatable(Result *__return_storage_ptr__,Model *format)

{
  TypeCase TVar1;
  undefined1 local_70 [8];
  string err;
  undefined1 local_40 [8];
  Result r;
  Model *format_local;
  
  r.m_message.field_2._8_8_ = format;
  Result::Result((Result *)local_40);
  TVar1 = Specification::Model::Type_case((Model *)r.m_message.field_2._8_8_);
  if ((((TVar1 - kPipelineClassifier < 3) || (TVar1 == kNeuralNetworkRegressor)) ||
      (TVar1 - kNeuralNetworkClassifier < 2)) || (TVar1 == kNeuralNetwork)) {
    Result::Result(__return_storage_ptr__,(Result *)local_40);
    err.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)local_70);
    std::__cxx11::string::operator=
              ((string *)local_70,"This model type is not supported for on-device update.");
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_70);
    err.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_70);
  }
  Result::~Result((Result *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Result validateCanModelBeUpdatable(const Specification::Model& format) {
        Result r;
        switch (format.Type_case()) {
            case Specification::Model::kNeuralNetwork:
            case Specification::Model::kNeuralNetworkRegressor:
            case Specification::Model::kNeuralNetworkClassifier:
            case Specification::Model::kKNearestNeighborsClassifier:
            case Specification::Model::kPipeline:
            case Specification::Model::kPipelineRegressor:
            case Specification::Model::kPipelineClassifier:
                return r;
            default: {
                std::string err;
                err = "This model type is not supported for on-device update.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
            }
        }
    }